

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::internal::
BlockImpl_dense<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_true>,_1,_-1,_false,_true>
::BlockImpl_dense(BlockImpl_dense<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false,_true>
                  *this,Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>
                        *xpr,Index startRow,Index startCol,Index blockRows,Index blockCols)

{
  undefined8 uVar1;
  long lVar2;
  
  MapBase<Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_true>,_1,_-1,_false>,_0>
  ::MapBase(&this->
             super_MapBase<Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_0>
            ,(xpr->
             super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
             ).
             super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_0>
             .m_data + startCol +
                       (xpr->
                       super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
                       ).
                       super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
                       .m_xpr.m_stride.super_Stride<_1,_0>.m_outer.m_value * startRow,blockRows,
            blockCols);
  (this->m_xpr).
  super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_0>
  .m_cols.m_value =
       (xpr->
       super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
       ).
       super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
       .
       super_MapBase<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_0>
       .m_cols.m_value;
  uVar1 = *(undefined8 *)
           &(xpr->
            super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
            ).
            super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_0>
            .field_0x8;
  (this->m_xpr).
  super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_0>
  .m_data = (xpr->
            super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
            ).
            super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_0>
            .m_data;
  *(undefined8 *)
   &(this->m_xpr).
    super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_0>
    .field_0x8 = uVar1;
  lVar2 = (xpr->
          super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
          ).
          super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
          .m_xpr.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value;
  (this->m_xpr).
  super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
  .m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_data = (xpr->
            super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
            ).
            super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
            .m_xpr.
            super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data;
  (this->m_xpr).
  super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
  .m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_rows.m_value = lVar2;
  (this->m_xpr).
  super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
  .m_xpr.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_cols.m_value =
       (xpr->
       super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
       ).
       super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
       .m_xpr.
       super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_cols.m_value;
  (this->m_xpr).
  super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
  .m_xpr.m_stride.super_Stride<_1,_0>.m_outer.m_value =
       (xpr->
       super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
       ).
       super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
       .m_xpr.m_stride.super_Stride<_1,_0>.m_outer.m_value;
  (this->m_xpr).
  super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
  .m_outerStride =
       (xpr->
       super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
       ).
       super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
       .m_outerStride;
  lVar2 = (xpr->
          super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
          ).
          super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
          .m_startCol.m_value;
  (this->m_xpr).
  super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
  .m_startRow.m_value =
       (xpr->
       super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
       ).
       super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
       .m_startRow.m_value;
  (this->m_xpr).
  super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
  .m_startCol.m_value = lVar2;
  variable_if_dynamic<long,_0>::variable_if_dynamic
            ((variable_if_dynamic<long,_0> *)&this->field_0x70,startRow);
  (this->m_startCol).m_value = startCol;
  this->m_outerStride =
       (this->m_xpr).
       super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_Eigen::Dense>
       .
       super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
       .m_xpr.m_stride.super_Stride<_1,_0>.m_outer.m_value;
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Base(xpr.data()+xpr.innerStride()*(XprTypeIsRowMajor?startCol:startRow) + xpr.outerStride()*(XprTypeIsRowMajor?startRow:startCol), blockRows, blockCols),
        m_xpr(xpr), m_startRow(startRow), m_startCol(startCol)
    {
      init();
    }